

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

vector<int,_std::allocator<int>_> *
cppcms::json::traits<std::vector<int,_std::allocator<int>_>_>::get
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,value *v)

{
  pointer pvVar1;
  int iVar2;
  uint uVar3;
  array *paVar4;
  ulong uVar5;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar4 = json::value::array(v);
  std::vector<int,_std::allocator<int>_>::resize
            (__return_storage_ptr__,
             (long)(paVar4->
                   super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(paVar4->
                   super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3);
  uVar3 = 0;
  while( true ) {
    uVar5 = (ulong)uVar3;
    pvVar1 = (paVar4->super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(paVar4->
                      super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>)
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) <= uVar5)
    break;
    iVar2 = traits<int>::get(pvVar1 + uVar5);
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar5] = iVar2;
    uVar3 = uVar3 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<T> get(value const &v)
		{
			std::vector<T> result;
			json::array const &a=v.array();
			result.resize(a.size());
			for(unsigned i=0;i<a.size();i++) 
				result[i]=a[i].get_value<T>();
			return result;
		}